

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cpp
# Opt level: O2

Transform *
phyr::Transform::perspective(Transform *__return_storage_ptr__,double fov,double near,double far)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 local_2a0 [96];
  double local_240;
  double dStack_238;
  double local_230;
  double dStack_228;
  Transform local_220;
  Transform local_120;
  
  local_2a0._0_8_ = 1.0;
  local_2a0._8_8_ = 0.0;
  local_2a0._16_8_ = 0.0;
  local_2a0._24_8_ = 0.0;
  local_2a0._32_8_ = 0.0;
  local_2a0._40_8_ = 1.0;
  local_2a0._48_8_ = 0.0;
  local_2a0._56_8_ = 0.0;
  local_2a0._64_8_ = 0.0;
  local_2a0._72_8_ = 0.0;
  auVar2._8_8_ = -far * near;
  auVar2._0_8_ = far;
  auVar1._8_8_ = far - near;
  auVar1._0_8_ = far - near;
  local_2a0._80_16_ = divpd(auVar2,auVar1);
  local_240 = 0.0;
  dStack_238 = 0.0;
  local_230 = 1.0;
  dStack_228 = 0.0;
  local_120.mat.d[0][0] = tan(fov * 0.017453292519943295 * 0.5);
  local_120.mat.d[0][0] = 1.0 / local_120.mat.d[0][0];
  local_120.invMat.d[0][0] = 1.0 / local_120.mat.d[0][0];
  local_120.mat.d[0][1] = 0.0;
  local_120.mat.d[0][2] = 0.0;
  local_120.mat.d[0][3] = 0.0;
  local_120.mat.d[1][0] = 0.0;
  local_120.mat.d[1][2] = 0.0;
  local_120.mat.d[1][3] = 0.0;
  local_120.mat.d[2][0] = 0.0;
  local_120.mat.d[2][1] = 0.0;
  local_120.mat.d[2][2] = 1.0;
  local_120.mat.d[2][3] = 0.0;
  local_120.mat.d[3][0] = 0.0;
  local_120.mat.d[3][1] = 0.0;
  local_120.mat.d[3][2] = 0.0;
  local_120.mat.d[3][3] = 1.0;
  local_120.invMat.d[0][1] = 0.0;
  local_120.invMat.d[0][2] = 0.0;
  local_120.invMat.d[0][3] = 0.0;
  local_120.invMat.d[1][0] = 0.0;
  local_120.invMat.d[1][2] = 0.0;
  local_120.invMat.d[1][3] = 0.0;
  local_120.invMat.d[2][0] = 0.0;
  local_120.invMat.d[2][1] = 0.0;
  local_120.invMat.d[2][2] = 1.0;
  local_120.invMat.d[2][3] = 0.0;
  local_120.invMat.d[3][0] = 0.0;
  local_120.invMat.d[3][1] = 0.0;
  local_120.invMat.d[3][2] = 0.0;
  local_120.invMat.d[3][3] = 1.0;
  local_120.mat.d[1][1] = local_120.mat.d[0][0];
  local_120.invMat.d[1][1] = local_120.invMat.d[0][0];
  Transform(&local_220,(Mat4x4 *)local_2a0);
  operator*(__return_storage_ptr__,&local_120,&local_220);
  return __return_storage_ptr__;
}

Assistant:

Transform Transform::perspective(Real fov, Real near, Real far) {
    // Matrix for projective divide
    Mat4x4 persMat(1, 0,                  0,                          0,
                   0, 1,                  0,                          0,
                   0, 0, far / (far - near), -far * near / (far - near),
                   0, 0,                  1,                          0);

    // Apply fov factor
    Real invTan = 1 / std::tan(radians(fov) / 2);
    return Transform::scale(invTan, invTan, 1) * Transform(persMat);
}